

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flops.cc
# Opt level: O1

void runAll(void)

{
  benchmark local_c0;
  
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  local_c0._24_8_ = 0;
  local_c0.mul0[0] = 1.001;
  local_c0.mul0[1] = 1.001;
  local_c0.mul0[2] = 1.001;
  local_c0.mul0[3] = 1.001;
  local_c0.mul0[4] = 1.001;
  local_c0.mul0[5] = 1.001;
  local_c0.mul0[6] = 1.001;
  local_c0.mul0[7] = 1.001;
  local_c0.mul1[0] = 1.002;
  local_c0.mul1[1] = 1.002;
  local_c0.mul1[2] = 1.002;
  local_c0.mul1[3] = 1.002;
  local_c0.mul1[4] = 1.002;
  local_c0.mul1[5] = 1.002;
  local_c0.mul1[6] = 1.002;
  local_c0.mul1[7] = 1.002;
  local_c0._vptr_benchmark = (_func_int **)&PTR_get_flops_per_iteration_00105a90;
  bench_kernel(&local_c0);
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  local_c0._24_8_ = 0;
  local_c0.mul0[0] = 1.001;
  local_c0.mul0[1] = 1.001;
  local_c0.mul0[2] = 1.001;
  local_c0.mul0[3] = 1.001;
  local_c0.mul0[4] = 1.001;
  local_c0.mul0[5] = 1.001;
  local_c0.mul0[6] = 1.001;
  local_c0.mul0[7] = 1.001;
  local_c0.mul1[0] = 1.002;
  local_c0.mul1[1] = 1.002;
  local_c0.mul1[2] = 1.002;
  local_c0.mul1[3] = 1.002;
  local_c0.mul1[4] = 1.002;
  local_c0.mul1[5] = 1.002;
  local_c0.mul1[6] = 1.002;
  local_c0.mul1[7] = 1.002;
  local_c0._vptr_benchmark = (_func_int **)&PTR_get_flops_per_iteration_00105b08;
  bench_kernel(&local_c0);
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  local_c0._24_8_ = 0;
  local_c0.mul0[0] = 1.001;
  local_c0.mul0[1] = 1.001;
  local_c0.mul0[2] = 1.001;
  local_c0.mul0[3] = 1.001;
  local_c0.mul0[4] = 1.001;
  local_c0.mul0[5] = 1.001;
  local_c0.mul0[6] = 1.001;
  local_c0.mul0[7] = 1.001;
  local_c0.mul1[0] = 1.002;
  local_c0.mul1[1] = 1.002;
  local_c0.mul1[2] = 1.002;
  local_c0.mul1[3] = 1.002;
  local_c0.mul1[4] = 1.002;
  local_c0.mul1[5] = 1.002;
  local_c0.mul1[6] = 1.002;
  local_c0.mul1[7] = 1.002;
  local_c0._vptr_benchmark = (_func_int **)&PTR_get_flops_per_iteration_00105b48;
  bench_kernel(&local_c0);
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  local_c0._24_8_ = 0;
  local_c0.mul0[0] = 1.001;
  local_c0.mul0[1] = 1.001;
  local_c0.mul0[2] = 1.001;
  local_c0.mul0[3] = 1.001;
  local_c0.mul0[4] = 1.001;
  local_c0.mul0[5] = 1.001;
  local_c0.mul0[6] = 1.001;
  local_c0.mul0[7] = 1.001;
  local_c0.mul1[0] = 1.002;
  local_c0.mul1[1] = 1.002;
  local_c0.mul1[2] = 1.002;
  local_c0.mul1[3] = 1.002;
  local_c0.mul1[4] = 1.002;
  local_c0.mul1[5] = 1.002;
  local_c0.mul1[6] = 1.002;
  local_c0.mul1[7] = 1.002;
  local_c0._vptr_benchmark = (_func_int **)&PTR_get_flops_per_iteration_00105b88;
  bench_kernel(&local_c0);
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  local_c0._24_8_ = 0;
  local_c0.mul0[0] = 1.001;
  local_c0.mul0[1] = 1.001;
  local_c0.mul0[2] = 1.001;
  local_c0.mul0[3] = 1.001;
  local_c0.mul0[4] = 1.001;
  local_c0.mul0[5] = 1.001;
  local_c0.mul0[6] = 1.001;
  local_c0.mul0[7] = 1.001;
  local_c0.mul1[0] = 1.002;
  local_c0.mul1[1] = 1.002;
  local_c0.mul1[2] = 1.002;
  local_c0.mul1[3] = 1.002;
  local_c0.mul1[4] = 1.002;
  local_c0.mul1[5] = 1.002;
  local_c0.mul1[6] = 1.002;
  local_c0.mul1[7] = 1.002;
  local_c0._vptr_benchmark = (_func_int **)&PTR_get_flops_per_iteration_00105bc8;
  bench_kernel(&local_c0);
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  local_c0._24_8_ = 0;
  local_c0.mul0[0] = 1.001;
  local_c0.mul0[1] = 1.001;
  local_c0.mul0[2] = 1.001;
  local_c0.mul0[3] = 1.001;
  local_c0.mul0[4] = 1.001;
  local_c0.mul0[5] = 1.001;
  local_c0.mul0[6] = 1.001;
  local_c0.mul0[7] = 1.001;
  local_c0.mul1[0] = 1.002;
  local_c0.mul1[1] = 1.002;
  local_c0.mul1[2] = 1.002;
  local_c0.mul1[3] = 1.002;
  local_c0.mul1[4] = 1.002;
  local_c0.mul1[5] = 1.002;
  local_c0.mul1[6] = 1.002;
  local_c0.mul1[7] = 1.002;
  local_c0._vptr_benchmark = (_func_int **)&PTR_get_flops_per_iteration_00105c08;
  bench_kernel(&local_c0);
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  local_c0._24_8_ = 0;
  local_c0.mul0[0] = 1.001;
  local_c0.mul0[1] = 1.001;
  local_c0.mul0[2] = 1.001;
  local_c0.mul0[3] = 1.001;
  local_c0.mul0[4] = 1.001;
  local_c0.mul0[5] = 1.001;
  local_c0.mul0[6] = 1.001;
  local_c0.mul0[7] = 1.001;
  local_c0.mul1[0] = 1.002;
  local_c0.mul1[1] = 1.002;
  local_c0.mul1[2] = 1.002;
  local_c0.mul1[3] = 1.002;
  local_c0.mul1[4] = 1.002;
  local_c0.mul1[5] = 1.002;
  local_c0.mul1[6] = 1.002;
  local_c0.mul1[7] = 1.002;
  local_c0._vptr_benchmark = (_func_int **)&PTR_get_flops_per_iteration_00105c48;
  bench_kernel(&local_c0);
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  local_c0._24_8_ = 0;
  local_c0.mul0[0] = 1.001;
  local_c0.mul0[1] = 1.001;
  local_c0.mul0[2] = 1.001;
  local_c0.mul0[3] = 1.001;
  local_c0.mul0[4] = 1.001;
  local_c0.mul0[5] = 1.001;
  local_c0.mul0[6] = 1.001;
  local_c0.mul0[7] = 1.001;
  local_c0.mul1[0] = 1.002;
  local_c0.mul1[1] = 1.002;
  local_c0.mul1[2] = 1.002;
  local_c0.mul1[3] = 1.002;
  local_c0.mul1[4] = 1.002;
  local_c0.mul1[5] = 1.002;
  local_c0.mul1[6] = 1.002;
  local_c0.mul1[7] = 1.002;
  local_c0._vptr_benchmark = (_func_int **)&PTR_get_flops_per_iteration_00105c88;
  bench_kernel(&local_c0);
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  local_c0._24_8_ = 0;
  local_c0.mul0[0] = 1.001;
  local_c0.mul0[1] = 1.001;
  local_c0.mul0[2] = 1.001;
  local_c0.mul0[3] = 1.001;
  local_c0.mul0[4] = 1.001;
  local_c0.mul0[5] = 1.001;
  local_c0.mul0[6] = 1.001;
  local_c0.mul0[7] = 1.001;
  local_c0.mul1[0] = 1.002;
  local_c0.mul1[1] = 1.002;
  local_c0.mul1[2] = 1.002;
  local_c0.mul1[3] = 1.002;
  local_c0.mul1[4] = 1.002;
  local_c0.mul1[5] = 1.002;
  local_c0.mul1[6] = 1.002;
  local_c0.mul1[7] = 1.002;
  local_c0._vptr_benchmark = (_func_int **)&PTR_get_flops_per_iteration_00105cc8;
  bench_kernel(&local_c0);
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  local_c0._24_8_ = 0;
  local_c0.mul0[0] = 1.001;
  local_c0.mul0[1] = 1.001;
  local_c0.mul0[2] = 1.001;
  local_c0.mul0[3] = 1.001;
  local_c0.mul0[4] = 1.001;
  local_c0.mul0[5] = 1.001;
  local_c0.mul0[6] = 1.001;
  local_c0.mul0[7] = 1.001;
  local_c0.mul1[0] = 1.002;
  local_c0.mul1[1] = 1.002;
  local_c0.mul1[2] = 1.002;
  local_c0.mul1[3] = 1.002;
  local_c0.mul1[4] = 1.002;
  local_c0.mul1[5] = 1.002;
  local_c0.mul1[6] = 1.002;
  local_c0.mul1[7] = 1.002;
  local_c0._vptr_benchmark = (_func_int **)&PTR_get_flops_per_iteration_00105d08;
  bench_kernel(&local_c0);
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  local_c0._24_8_ = 0;
  local_c0.mul0[0] = 1.001;
  local_c0.mul0[1] = 1.001;
  local_c0.mul0[2] = 1.001;
  local_c0.mul0[3] = 1.001;
  local_c0.mul0[4] = 1.001;
  local_c0.mul0[5] = 1.001;
  local_c0.mul0[6] = 1.001;
  local_c0.mul0[7] = 1.001;
  local_c0.mul1[0] = 1.002;
  local_c0.mul1[1] = 1.002;
  local_c0.mul1[2] = 1.002;
  local_c0.mul1[3] = 1.002;
  local_c0.mul1[4] = 1.002;
  local_c0.mul1[5] = 1.002;
  local_c0.mul1[6] = 1.002;
  local_c0.mul1[7] = 1.002;
  local_c0._vptr_benchmark = (_func_int **)&PTR_get_flops_per_iteration_00105d48;
  bench_kernel(&local_c0);
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  local_c0._24_8_ = 0;
  local_c0.mul0[0] = 1.001;
  local_c0.mul0[1] = 1.001;
  local_c0.mul0[2] = 1.001;
  local_c0.mul0[3] = 1.001;
  local_c0.mul0[4] = 1.001;
  local_c0.mul0[5] = 1.001;
  local_c0.mul0[6] = 1.001;
  local_c0.mul0[7] = 1.001;
  local_c0.mul1[0] = 1.002;
  local_c0.mul1[1] = 1.002;
  local_c0.mul1[2] = 1.002;
  local_c0.mul1[3] = 1.002;
  local_c0.mul1[4] = 1.002;
  local_c0.mul1[5] = 1.002;
  local_c0.mul1[6] = 1.002;
  local_c0.mul1[7] = 1.002;
  local_c0._vptr_benchmark = (_func_int **)&PTR_get_flops_per_iteration_00105d88;
  bench_kernel(&local_c0);
  return;
}

Assistant:

void runAll()
{
    bench_kernel(benchmark_1 {});
    bench_kernel(benchmark_2 {});
    bench_kernel(benchmark_3 {});
    bench_kernel(benchmark_4 {});
    bench_kernel(benchmark_5 {});
    bench_kernel(benchmark_6 {});
    bench_kernel(benchmark_7 {});
    bench_kernel(benchmark_8 {});
    bench_kernel(benchmark_9 {});
    bench_kernel(benchmark_10 {});
    bench_kernel(benchmark_11 {});
    bench_kernel(benchmark_12 {});
}